

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

ComponentPtr createComponentInModel(ModelPtr *model,string *componentName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ComponentPtr CVar1;
  
  libcellml::Component::create();
  libcellml::NamedEntity::setName
            ((string *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  libcellml::ComponentEntity::addComponent((shared_ptr *)(componentName->_M_dataplus)._M_p);
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)model;
  return (ComponentPtr)CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ComponentPtr createComponentInModel(const libcellml::ModelPtr &model, const std::string &componentName)
{
    libcellml::ComponentPtr component = libcellml::Component::create();
    component->setName(componentName);
    model->addComponent(component);
    return component;
}